

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::Response::set_content_provider
          (Response *this,size_t in_length,string *content_type,ContentProvider *provider,
          ContentProviderResourceReleaser *resource_releaser)

{
  string *in_RCX;
  size_t in_RSI;
  Response *in_RDI;
  string *in_R8;
  function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *__x;
  function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  __x = (function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
        &stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  set_header(in_RDI,in_R8,in_RCX);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  in_RDI->content_length_ = in_RSI;
  if (in_RSI != 0) {
    detail::std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::operator=
              (in_stack_ffffffffffffffa0,__x);
  }
  detail::std::function<void_(bool)>::operator=
            ((function<void_(bool)> *)in_stack_ffffffffffffffa0,(function<void_(bool)> *)__x);
  in_RDI->is_chunked_content_provider_ = false;
  return;
}

Assistant:

inline void Response::set_content_provider(
    size_t in_length, const std::string &content_type, ContentProvider provider,
    ContentProviderResourceReleaser resource_releaser) {
  set_header("Content-Type", content_type);
  content_length_ = in_length;
  if (in_length > 0) { content_provider_ = std::move(provider); }
  content_provider_resource_releaser_ = std::move(resource_releaser);
  is_chunked_content_provider_ = false;
}